

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createShaderModuleTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ProgramCollection<vk::ProgramBinary> *this;
  VkDevice device;
  DeviceInterface *deviceInterface;
  ProgramBinary *binary;
  allocator<char> local_89;
  string local_88;
  string local_68;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_48;
  
  device = Context::getDevice(context);
  deviceInterface = Context::getDeviceInterface(context);
  this = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"test",&local_89);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this,&local_68);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_88,deviceInterface,device,binary,0);
  local_48.m_data.deleter.m_device = (VkDevice)local_88.field_2._M_allocated_capacity;
  local_48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_88.field_2._8_8_;
  local_48.m_data.object.m_internal = (deUint64)local_88._M_dataplus._M_p;
  local_48.m_data.deleter.m_deviceIface = (DeviceInterface *)local_88._M_string_length;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  local_88.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Creating shader module succeeded",(allocator<char> *)&local_68);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_48);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createShaderModuleTest (Context& context)
{
	const VkDevice					vkDevice	= context.getDevice();
	const DeviceInterface&			vk			= context.getDeviceInterface();
	const Unique<VkShaderModule>	shader		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("test"), 0));

	return tcu::TestStatus::pass("Creating shader module succeeded");
}